

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_173::TypeRefining::run(TypeRefining *this,Module *module)

{
  bool bVar1;
  PassOptions *pPVar2;
  undefined1 local_200 [8];
  Propagator propagator;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  TypeRefining *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    pPVar2 = Pass::getPassOptions(&this->super_Pass);
    if ((pPVar2->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [37])0x28d637c);
      Fatal::~Fatal(&local_1a0);
    }
    StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_200,local_18);
    if ((this->gufa & 1U) == 0) {
      computeFinalInfos(this,local_18,(Propagator *)local_200);
    }
    else {
      computeFinalInfosGUFA(this,local_18,(Propagator *)local_200);
    }
    useFinalInfos(this,local_18,(Propagator *)local_200);
    StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_200);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "TypeRefining requires --closed-world";
    }

    Propagator propagator(*module);

    // Compute our main data structure, finalInfos, either normally or using
    // GUFA.
    if (!gufa) {
      computeFinalInfos(module, propagator);
    } else {
      computeFinalInfosGUFA(module, propagator);
    }

    useFinalInfos(module, propagator);
  }